

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse_data.hpp
# Opt level: O0

pair<std::tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
* __thiscall
Disa::insert<double,unsigned_long,int>
          (pair<std::tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
           *__return_storage_ptr__,Disa *this,CSR_Data<double,_unsigned_long> *data,int *row,
          int *column,double *value)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  ostream *poVar4;
  unsigned_long uVar5;
  reference puVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  bool local_169;
  tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_168;
  const_iterator local_150;
  double *local_148;
  value_type_conflict local_140;
  const_iterator local_138;
  unsigned_long *local_130;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_128;
  __unspec local_119;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_118;
  type local_109;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_108;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  non_zeros;
  tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_f8;
  __tuple_element_t<2UL,_tuple<__normal_iterator<unsigned_long_*,_vector<unsigned_long,_allocator<unsigned_long>_>_>,___normal_iterator<unsigned_long_*,_vector<unsigned_long,_allocator<unsigned_long>_>_>,___normal_iterator<double_*,_vector<double,_allocator<double>_>_>_>_>
  *local_e0;
  type *iter_value;
  type *iter_column;
  type *iter_row;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_b0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  iter_row_start;
  int local_98;
  int local_94;
  undefined **local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  value_type_conflict1 *local_30;
  double *value_local;
  int *column_local;
  int *row_local;
  CSR_Data<double,_unsigned_long> *data_local;
  
  local_30 = (value_type_conflict1 *)column;
  value_local = (double *)row;
  column_local = (int *)data;
  row_local = (int *)this;
  data_local = (CSR_Data<double,_unsigned_long> *)__return_storage_ptr__;
  if (*(int *)&(data->row_offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start < 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"\n");
    local_58 = &PTR_s__workspace_llm4binary_github_lic_001b8758;
    console_format_abi_cxx11_(&local_50,(Disa *)0x0,(Log_Level)&local_58,(source_location *)row);
    poVar4 = std::operator<<(poVar4,(string *)&local_50);
    poVar4 = std::operator<<(poVar4,"Row index must be positive.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_50);
    exit(1);
  }
  if (-1 < *row) {
    iVar1 = *(int *)&(data->row_offset).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
    uVar5 = size_row<double,unsigned_long>((CSR_Data<double,_unsigned_long> *)this);
    piVar2 = row_local;
    if (uVar5 <= (ulong)(long)iVar1) {
      local_94 = *column_local + 1;
      uVar5 = size_column<double,unsigned_long>((CSR_Data<double,_unsigned_long> *)row_local);
      local_98 = (int)uVar5;
      resize<double,unsigned_long,int>
                ((CSR_Data<double,_unsigned_long> *)piVar2,&local_94,&local_98);
    }
    iVar1 = *(int *)value_local;
    uVar5 = size_column<double,unsigned_long>((CSR_Data<double,_unsigned_long> *)row_local);
    piVar2 = row_local;
    if (uVar5 <= (ulong)(long)iVar1) {
      uVar5 = size_row<double,unsigned_long>((CSR_Data<double,_unsigned_long> *)row_local);
      iter_row_start._M_current._4_4_ = (undefined4)uVar5;
      iter_row_start._M_current._0_4_ = *(int *)value_local + 1;
      resize<double,unsigned_long,int>
                ((CSR_Data<double,_unsigned_long> *)piVar2,
                 (int *)((long)&iter_row_start._M_current + 4),(int *)&iter_row_start);
    }
    local_b0._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)row_local);
    local_a8 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator+(&local_b0,(long)*column_local);
    lower_bound<double,unsigned_long,int>
              ((type *)&iter_row,(Disa *)row_local,(CSR_Data<double,_unsigned_long> *)column_local,
               (int *)value_local,column);
    iter_column = std::
                  get<0ul,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                            ((tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                              *)&iter_row);
    iter_value = (type *)std::
                         get<1ul,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                                   ((tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                                     *)&iter_row);
    local_e0 = std::
               get<2ul,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                         ((tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                           *)&iter_row);
    bVar3 = __gnu_cxx::
            operator==<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      (iter_column,&local_a8);
    if ((bVar3) &&
       (puVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)iter_value), *puVar6 == (long)*(int *)value_local)) {
      std::
      make_tuple<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>&,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>&>
                (&local_f8,iter_column,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)iter_value,local_e0);
      non_zeros._M_current._7_1_ = 0;
      std::
      pair<std::tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
      ::
      pair<std::tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool,_true>
                (__return_storage_ptr__,&local_f8,(bool *)((long)&non_zeros._M_current + 7));
    }
    else {
      local_108 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator+(&local_a8,1);
      while( true ) {
        local_118._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)row_local);
        local_109 = (type)__gnu_cxx::
                          operator<=><unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                                    (&local_108,&local_118);
        std::__cmp_cat::__unspec::__unspec(&local_119,(__unspec *)0x0);
        bVar3 = std::operator<(local_109);
        if (!bVar3) break;
        local_128 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator++(&local_108,0);
        puVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_128);
        *puVar6 = *puVar6 + 1;
      }
      this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(row_local + 6);
      __gnu_cxx::
      __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
      ::__normal_iterator<unsigned_long*>
                ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  *)&local_138,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)iter_value);
      local_140 = (value_type_conflict)*(int *)value_local;
      local_130 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
                            (this_00,local_138,&local_140);
      iter_value->_M_current = (double *)local_130;
      this_01 = (vector<double,_std::allocator<double>_> *)(row_local + 0xc);
      __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
      __normal_iterator<double*>
                ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                 &local_150,local_e0);
      local_148 = (double *)
                  std::vector<double,_std::allocator<double>_>::insert(this_01,local_150,local_30);
      local_e0->_M_current = local_148;
      std::
      make_tuple<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>const&,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>&>
                (&local_168,&local_a8,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)iter_value,local_e0);
      local_169 = true;
      std::
      pair<std::tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
      ::
      pair<std::tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool,_true>
                (__return_storage_ptr__,&local_168,&local_169);
    }
    return __return_storage_ptr__;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"\n");
  local_90 = &PTR_s__workspace_llm4binary_github_lic_001b8770;
  console_format_abi_cxx11_(&local_88,(Disa *)0x0,(Log_Level)&local_90,(source_location *)row);
  poVar4 = std::operator<<(poVar4,(string *)&local_88);
  poVar4 = std::operator<<(poVar4,"Columns index must be positive.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_88);
  exit(1);
}

Assistant:

std::pair<typename CSR_Data<_value_type, _index_type>::iterator, bool> insert(CSR_Data<_value_type, _index_type>& data,
                                                                              const _arg_index_type& row,
                                                                              const _arg_index_type& column,
                                                                              const _value_type& value) {

  // Check sizes
  ASSERT_DEBUG(row >= 0, "Row index must be positive.");
  ASSERT_DEBUG(column >= 0, "Columns index must be positive.");

  // Resize if we need to.
  if(row >= size_row(data)) resize(data, row + 1, static_cast<_arg_index_type>(size_column(data)));
  if(column >= size_column(data)) resize(data, static_cast<_arg_index_type>(size_row(data)), column + 1);

  // Search for new insert
  const auto iter_row_start = data.row_offset.begin() + row;  // tricky, only create after resizing.
  auto [iter_row, iter_column, iter_value] = lower_bound(data, row, column);

  // Entry exists, return no insert.
  if(iter_row == iter_row_start && *iter_column == column)
    return {std::make_tuple(iter_row, iter_column, iter_value), false};

  // Insert new entry.
  for(auto non_zeros = iter_row_start + 1; non_zeros < data.row_offset.end(); ++(*non_zeros++)) {};  // increment and ++
  iter_column = data.i_column.insert(iter_column, column);
  iter_value = data.value.insert(iter_value, value);
  return {std::make_tuple(iter_row_start, iter_column, iter_value), true};
}